

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<long,_long_long,_10>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *lhs,longlong *rhs,long *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  lVar2 = *lhs;
  lVar3 = *rhs;
  lVar1 = lVar3 + lVar2;
  if (lVar2 < 0) {
    bVar5 = -1 < lVar3;
    bVar4 = lVar1 <= lVar2;
  }
  else {
    bVar5 = lVar3 < 0;
    bVar4 = lVar2 <= lVar1;
  }
  if ((bool)(bVar4 | bVar5)) {
    *result = lVar1;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::int64_t, rhs signed
        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs + (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // mixed sign cannot overflow
            if( rhs >= 0 && tmp < lhs )
                E::SafeIntOnOverflow();
        }
        else
        {
            // lhs negative
            if( rhs < 0 && tmp > lhs )
                E::SafeIntOnOverflow();
        }

        result = (T)tmp;
    }